

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O2

void dumb_it_add_lpc(DUMB_IT_SIGDATA *sigdata)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  IT_SAMPLE *pIVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  uint n;
  size_t __size;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  float lpc [64];
  float lpc_output [128];
  float lpc_input [512];
  
  iVar11 = 0;
  while (iVar11 < sigdata->n_samples) {
    pIVar4 = sigdata->sample;
    bVar2 = pIVar4[iVar11].flags;
    iVar10 = iVar11;
    if ((bVar2 & 0x11) == 1) {
      uVar3 = pIVar4[iVar11].length;
      if ((int)uVar3 < 0x20) {
        bVar9 = bVar2 >> 1 & 1;
        iVar10 = 2 - (uint)((bVar2 & 4) == 0) << bVar9;
        pIVar4[iVar11].length = uVar3 + 0x40;
        iVar5 = uVar3 << ((bVar2 & 4) >> 2) + bVar9;
        pvVar6 = realloc(pIVar4[iVar11].data,(long)(iVar10 * 0x40 + iVar5));
        pIVar4[iVar11].data = pvVar6;
        memset((void *)((long)iVar5 + (long)pvVar6),0,(ulong)(uint)(iVar10 * 0x40));
      }
      else {
        n = 0x100;
        if (uVar3 < 0x100) {
          n = uVar3;
        }
        iVar5 = uVar3 - n;
        pvVar6 = pIVar4[iVar11].data;
        uVar12 = (ulong)n;
        if ((bVar2 & 4) == 0) {
          if ((bVar2 & 2) == 0) {
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              lpc_input[uVar7] = (float)(int)*(char *)((long)pvVar6 + uVar7 + (long)iVar5);
            }
          }
          else {
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              lpc_input[uVar7] = (float)(int)*(short *)((long)pvVar6 + uVar7 * 2 + (long)iVar5 * 2);
            }
          }
          vorbis_lpc_from_data(lpc_input,lpc,n,0x20);
          vorbis_lpc_predict(lpc,lpc_output + uVar12 + 0x60,0x20,lpc_output,0x40);
          if ((bVar2 & 2) == 0) {
            pvVar6 = realloc(pvVar6,(ulong)uVar3 + 0x40);
            pIVar4[iVar11].data = pvVar6;
            iVar5 = pIVar4[iVar11].length;
            pIVar4[iVar11].length = iVar5 + 0x40;
            for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
              *(char *)((long)pvVar6 + lVar8 + iVar5) = (char)(int)lpc_output[lVar8];
            }
          }
          else {
            pvVar6 = realloc(pvVar6,(ulong)(uVar3 * 2 + 0x80));
            pIVar4[iVar11].data = pvVar6;
            iVar5 = pIVar4[iVar11].length;
            pIVar4[iVar11].length = iVar5 + 0x40;
            for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
              *(short *)((long)pvVar6 + lVar8 * 2 + (long)iVar5 * 2) = (short)(int)lpc_output[lVar8]
              ;
            }
          }
        }
        else {
          lVar8 = (long)(iVar5 * 2);
          if ((bVar2 & 2) == 0) {
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              lpc_input[uVar7] = (float)(int)*(char *)((long)pvVar6 + uVar7 * 2 + lVar8);
              lpc_input[uVar7 + 0x100] = (float)(int)*(char *)((long)pvVar6 + uVar7 * 2 + lVar8 + 1)
              ;
            }
          }
          else {
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              lpc_input[uVar7] = (float)(int)*(short *)((long)pvVar6 + uVar7 * 4 + lVar8 * 2);
              lpc_input[uVar7 + 0x100] =
                   (float)(int)*(short *)((long)pvVar6 + uVar7 * 4 + lVar8 * 2 + 2);
            }
          }
          vorbis_lpc_from_data(lpc_input,lpc,n,0x20);
          vorbis_lpc_from_data(lpc_input + 0x100,lpc + 0x20,n,0x20);
          vorbis_lpc_predict(lpc,lpc_output + uVar12 + 0x60,0x20,lpc_output,0x40);
          vorbis_lpc_predict(lpc + 0x20,lpc_input + uVar12 + 0xe0,0x20,lpc_output + 0x40,0x40);
          __size = (size_t)(int)(uVar3 * 2 + 0x80);
          if ((bVar2 & 2) == 0) {
            pvVar6 = realloc(pvVar6,__size);
            pIVar4[iVar11].data = pvVar6;
            iVar5 = pIVar4[iVar11].length;
            pIVar4[iVar11].length = iVar5 + 0x40;
            for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
              fVar1 = lpc_output[lVar8 + 0x40];
              *(char *)((long)pvVar6 + lVar8 * 2 + (long)(iVar5 * 2)) = (char)(int)lpc_output[lVar8]
              ;
              *(char *)((long)pvVar6 + lVar8 * 2 + (long)(iVar5 * 2) + 1) = (char)(int)fVar1;
            }
          }
          else {
            pvVar6 = realloc(pvVar6,__size * 2);
            pIVar4[iVar11].data = pvVar6;
            iVar5 = pIVar4[iVar11].length;
            pIVar4[iVar11].length = iVar5 + 0x40;
            for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
              auVar13._0_4_ = (int)lpc_output[lVar8];
              auVar13._4_4_ = (int)lpc_output[lVar8 + 0x40];
              auVar13._8_8_ = 0;
              auVar13 = pshuflw(auVar13,auVar13,0xe8);
              *(int *)((long)pvVar6 + lVar8 * 4 + (long)(iVar5 * 2) * 2) = auVar13._0_4_;
            }
          }
        }
      }
    }
    iVar11 = iVar10 + 1;
  }
  return;
}

Assistant:

void dumb_it_add_lpc(struct DUMB_IT_SIGDATA *sigdata){
    float lpc[lpc_order * 2];
    float lpc_input[lpc_max * 2];
    float lpc_output[lpc_extra * 2];

    signed char * s8;
    signed short * s16;

    int n, o, offset, lpc_samples;

    for ( n = 0; n < sigdata->n_samples; n++ ) {
        IT_SAMPLE * sample = sigdata->sample + n;
        if ( ( sample->flags & ( IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP) ) == IT_SAMPLE_EXISTS ) {
            /* If we have enough sample data to train the filter, use the filter to generate the padding */
            if ( sample->length >= lpc_order ) {
                lpc_samples = sample->length;
                if (lpc_samples > lpc_max) lpc_samples = lpc_max;
                offset = sample->length - lpc_samples;

                if ( sample->flags & IT_SAMPLE_STEREO )
                {
                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) sample->data;
                        s16 += offset * 2;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s16[ o * 2 + 0 ];
                            lpc_input[ o + lpc_max ] = s16[ o * 2 + 1 ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) sample->data;
                        s8 += offset * 2;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s8[ o * 2 + 0 ];
                            lpc_input[ o + lpc_max ] = s8[ o * 2 + 1 ];
                        }
                    }

                    vorbis_lpc_from_data( lpc_input, lpc, lpc_samples, lpc_order );
                    vorbis_lpc_from_data( lpc_input + lpc_max, lpc + lpc_order, lpc_samples, lpc_order );

                    vorbis_lpc_predict( lpc, lpc_input + lpc_samples - lpc_order, lpc_order, lpc_output, lpc_extra );
                    vorbis_lpc_predict( lpc + lpc_order, lpc_input + lpc_max + lpc_samples - lpc_order, lpc_order, lpc_output + lpc_extra, lpc_extra );

                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) realloc( sample->data, ( sample->length + lpc_extra ) * 2 * sizeof(short) );
                        sample->data = s16;

                        s16 += sample->length * 2;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s16[ o * 2 + 0 ] = (signed short)lpc_output[ o ];
                            s16[ o * 2 + 1 ] = (signed short)lpc_output[ o + lpc_extra ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) realloc( sample->data, ( sample->length + lpc_extra ) * 2 );
                        sample->data = s8;

                        s8 += sample->length * 2;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s8[ o * 2 + 0 ] = (signed char)lpc_output[ o ];
                            s8[ o * 2 + 1 ] = (signed char)lpc_output[ o + lpc_extra ];
                        }
                    }
                }
                else
                {
                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) sample->data;
                        s16 += offset;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s16[ o ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) sample->data;
                        s8 += offset;
                        for ( o = 0; o < lpc_samples; o++ )
                        {
                            lpc_input[ o ] = s8[ o ];
                        }
                    }

                    vorbis_lpc_from_data( lpc_input, lpc, lpc_samples, lpc_order );

                    vorbis_lpc_predict( lpc, lpc_input + lpc_samples - lpc_order, lpc_order, lpc_output, lpc_extra );

                    if ( sample->flags & IT_SAMPLE_16BIT )
                    {
                        s16 = ( signed short * ) realloc( sample->data, ( sample->length + lpc_extra ) * sizeof(short) );
                        sample->data = s16;

                        s16 += sample->length;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s16[ o ] = (signed short)lpc_output[ o ];
                        }
                    }
                    else
                    {
                        s8 = ( signed char * ) realloc( sample->data, sample->length + lpc_extra );
                        sample->data = s8;

                        s8 += sample->length;
                        sample->length += lpc_extra;

                        for ( o = 0; o < lpc_extra; o++ )
                        {
                            s8[ o ] = (signed char)lpc_output[ o ];
                        }
                    }
                }
            }
            else
            /* Otherwise, pad with silence. */
            {
                offset = sample->length;
                lpc_samples = lpc_extra;

                sample->length += lpc_samples;

                n = 1;
                if ( sample->flags & IT_SAMPLE_STEREO ) n *= 2;
                if ( sample->flags & IT_SAMPLE_16BIT ) n *= 2;

                offset *= n;
                lpc_samples *= n;

                sample->data = realloc( sample->data, offset + lpc_samples );
                memset( (char*)sample->data + offset, 0, lpc_samples );
            }
        }
    }
}